

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  Name *local_30;
  Name *nextName;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names_local;
  char *end_local;
  char *in_local;
  
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    local_30 = (Name *)0x0;
    nextName = (Name *)names;
    names_local = (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)end;
    end_local = in;
    end_local = parseName(in,end,&local_30);
    if (local_30 != (Name *)0x0) {
      std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::push_back
                ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)nextName,
                 &local_30);
    }
    while ((*Grammar::CommaSeparator == *end_local &&
           (end_local = getNextSeparator<char>(end_local,(char *)names_local),
           *Grammar::CommaSeparator == *end_local))) {
      end_local = parseName(end_local,(char *)names_local,&local_30);
      if (local_30 != (Name *)0x0) {
        std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::push_back
                  ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)nextName,
                   &local_30);
      }
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseReference(char *in, char *end, std::vector<Name *> &names) {
    if (nullptr == in || in == end) {
        return in;
    }

    Name *nextName(nullptr);
    in = parseName(in, end, &nextName);
    if (nextName) {
        names.push_back(nextName);
    }
    while (Grammar::CommaSeparator[0] == *in) {
        in = getNextSeparator(in, end);
        if (Grammar::CommaSeparator[0] == *in) {
            in = parseName(in, end, &nextName);
            if (nextName) {
                names.push_back(nextName);
            }
        } else {
            break;
        }
    }

    return in;
}